

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_LibraryTransferDelays(Mio_Library_t *pLibD,Mio_Library_t *pLibS)

{
  Mio_Pin_t *local_38;
  Mio_Pin_t *pPinS;
  Mio_Pin_t *pPinD;
  Mio_Gate_t *pGateS;
  Mio_Gate_t *pGateD;
  Mio_Library_t *pLibS_local;
  Mio_Library_t *pLibD_local;
  
  for (pPinD = (Mio_Pin_t *)Mio_LibraryReadGates(pLibS); pPinD != (Mio_Pin_t *)0x0;
      pPinD = (Mio_Pin_t *)Mio_GateReadNext((Mio_Gate_t *)pPinD)) {
    for (pGateS = Mio_LibraryReadGates(pLibD); pGateS != (Mio_Gate_t *)0x0;
        pGateS = Mio_GateReadNext(pGateS)) {
      if ((double)(pGateS->field_15).uTruth == pPinD[1].dLoadMax) {
        local_38 = Mio_GateReadPins((Mio_Gate_t *)pPinD);
        for (pPinS = Mio_GateReadPins(pGateS); pPinS != (Mio_Pin_t *)0x0;
            pPinS = Mio_PinReadNext(pPinS)) {
          if (local_38 == (Mio_Pin_t *)0x0) {
            pPinS->dDelayBlockRise = 0.0;
            pPinS->dDelayBlockFall = 0.0;
            pPinS->dDelayBlockMax = 0.0;
          }
          else {
            pPinS->dDelayBlockRise = local_38->dDelayBlockRise;
            pPinS->dDelayBlockFall = local_38->dDelayBlockFall;
            pPinS->dDelayBlockMax = local_38->dDelayBlockMax;
            local_38 = Mio_PinReadNext(local_38);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Mio_LibraryTransferDelays( Mio_Library_t * pLibD, Mio_Library_t * pLibS )
{
    Mio_Gate_t * pGateD, * pGateS;
    Mio_Pin_t * pPinD, * pPinS;
    Mio_LibraryForEachGate( pLibS, pGateS )
    {
        Mio_LibraryForEachGate( pLibD, pGateD )
        {
            if ( pGateD->uTruth != pGateS->uTruth )
                continue;
            pPinS = Mio_GateReadPins( pGateS );
            Mio_GateForEachPin( pGateD, pPinD )
            {
                if (pPinS)
                {
                    pPinD->dDelayBlockRise = pPinS->dDelayBlockRise;
                    pPinD->dDelayBlockFall = pPinS->dDelayBlockFall;
                    pPinD->dDelayBlockMax  = pPinS->dDelayBlockMax;
                    pPinS = Mio_PinReadNext(pPinS);
                }
                else
                {
                    pPinD->dDelayBlockRise = 0;
                    pPinD->dDelayBlockFall = 0;
                    pPinD->dDelayBlockMax  = 0;
                }
            }
        }
    }
}